

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void __thiscall backward::SourceFile::SourceFile(SourceFile *this,string *path)

{
  bool bVar1;
  long lVar2;
  basic_ifstream<char,_std::char_traits<char>_> *pbVar3;
  char cVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  pointer pbVar6;
  long *plVar7;
  basic_ifstream<char,_std::char_traits<char>_> *pbVar8;
  long *plVar9;
  long lVar10;
  basic_ifstream<char,_std::char_traits<char>_> *__tmp;
  ulong uVar11;
  basic_ifstream<char,_std::char_traits<char>_> *__tmp_1;
  string new_path;
  __string_type __str;
  long *local_70;
  long local_60;
  long lStack_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  (this->_file)._val = (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
  (this->_file)._empty = true;
  pvVar5 = get_paths_from_env_variable_abi_cxx11_(this);
  pbVar6 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar5->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar6) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      local_70 = &local_60;
      lVar2 = *(long *)((long)pbVar6 + lVar10 + -8);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar2,
                 *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar10) + lVar2);
      std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,(ulong)(path->_M_dataplus)._M_p);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar7[3];
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar7;
      }
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      pbVar8 = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
      std::ifstream::ifstream(pbVar8,(char *)local_70,_S_in);
      pbVar3 = (this->_file)._val;
      (this->_file)._val = pbVar8;
      bVar1 = (this->_file)._empty;
      (this->_file)._empty = false;
      if (pbVar3 != (basic_ifstream<char,_std::char_traits<char>_> *)0x0 && bVar1 == false) {
        (**(code **)(*(long *)pbVar3 + 8))();
      }
      cVar4 = std::__basic_file<char>::is_open();
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (cVar4 != '\0') break;
      uVar11 = uVar11 + 1;
      pbVar6 = (pvVar5->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x20;
    } while (uVar11 < (ulong)((long)(pvVar5->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5)
            );
  }
  if (((this->_file)._val != (basic_ifstream<char,_std::char_traits<char>_> *)0x0 &&
       (this->_file)._empty == false) && (cVar4 = std::__basic_file<char>::is_open(), cVar4 != '\0')
     ) {
    return;
  }
  pbVar8 = (basic_ifstream<char,_std::char_traits<char>_> *)operator_new(0x208);
  std::ifstream::ifstream(pbVar8,(path->_M_dataplus)._M_p,_S_in);
  pbVar3 = (this->_file)._val;
  (this->_file)._val = pbVar8;
  bVar1 = (this->_file)._empty;
  (this->_file)._empty = false;
  if (pbVar3 != (basic_ifstream<char,_std::char_traits<char>_> *)0x0 && bVar1 == false) {
    (**(code **)(*(long *)pbVar3 + 8))();
  }
  return;
}

Assistant:

SourceFile(const std::string &path) {
    // 1. If BACKWARD_CXX_SOURCE_PREFIXES is set then assume it contains
    //    a colon-separated list of path prefixes.  Try prepending each
    //    to the given path until a valid file is found.
    const std::vector<std::string> &prefixes = get_paths_from_env_variable();
    for (size_t i = 0; i < prefixes.size(); ++i) {
      // Double slashes (//) should not be a problem.
      std::string new_path = prefixes[i] + '/' + path;
      _file.reset(new std::ifstream(new_path.c_str()));
      if (is_open())
        break;
    }
    // 2. If no valid file found then fallback to opening the path as-is.
    if (!_file || !is_open()) {
      _file.reset(new std::ifstream(path.c_str()));
    }
  }